

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

wchar_t dungeon_get_next_level(player *p,wchar_t dlev,wchar_t added)

{
  wchar_t wVar1;
  _Bool _Var2;
  wchar_t wVar3;
  
  wVar3 = (uint)z_info->stair_skip * added + dlev;
  wVar1 = (uint)z_info->max_depth + L'\xffffffff';
  if (wVar3 < (int)(uint)z_info->max_depth) {
    wVar1 = wVar3;
  }
  wVar3 = L'\0';
  if (L'\0' < wVar1) {
    wVar3 = wVar1;
  }
  if (dlev <= wVar3) {
    do {
      _Var2 = is_quest(p,dlev);
      if (_Var2) {
        return dlev;
      }
      dlev = dlev + L'\x01';
    } while (wVar3 + L'\x01' != dlev);
  }
  return wVar3;
}

Assistant:

int dungeon_get_next_level(struct player *p, int dlev, int added)
{
	int target_level, i;

	/* Get target level */
	target_level = dlev + added * z_info->stair_skip;

	/* Don't allow levels below max */
	if (target_level > z_info->max_depth - 1)
		target_level = z_info->max_depth - 1;

	/* Don't allow levels above the town */
	if (target_level < 0) target_level = 0;

	/* Check intermediate levels for quests */
	for (i = dlev; i <= target_level; i++) {
		if (is_quest(p, i)) return i;
	}

	return target_level;
}